

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

SerializedCSVReaderOptions *
duckdb::SerializedCSVReaderOptions::Deserialize
          (SerializedCSVReaderOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  vector<bool,_true> *pvVar1;
  long lVar2;
  FileCompressionType FVar3;
  undefined1 uVar4;
  CSVOption<char> single_byte_delimiter;
  CSVOption<char> CVar5;
  CSVOption<char> CVar6;
  CSVOption<bool> CVar7;
  CSVOption<duckdb::NewLineIdentifier> CVar8;
  CSVOption<char> CVar9;
  CSVOption<bool> CVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int **pp_Var15;
  undefined1 *puVar16;
  CSVOption<bool> CVar17;
  CSVOption<unsigned_long> CVar18;
  CSVOption<unsigned_long> CVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_rejects_table_name;
  vector<duckdb::LogicalType,_true> options_sql_type_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_name_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_null_str;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_rejects_scan_name;
  type ret_6;
  type ret_4;
  type ret_1;
  type ret;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_multi_byte_delimiter;
  MultiFileOptions file_options;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  options_sql_types_per_column;
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  options_dialect_options_date_format;
  bool local_428;
  bool local_424;
  bool local_420;
  bool local_41c;
  bool local_418;
  bool local_414;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  undefined8 uStack_3e8;
  idx_t local_3e0;
  idx_t local_3d8;
  vector<bool,_true> local_3d0;
  vector<bool,_true> local_3a8;
  vector<bool,_true> local_380;
  ulong *local_358;
  long local_350;
  undefined1 local_348;
  uint7 uStack_347;
  undefined8 uStack_340;
  vector<duckdb::LogicalType,_true> local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2f8;
  undefined4 local_2d6;
  undefined3 uStack_2d2;
  undefined4 local_2cf;
  undefined3 uStack_2cb;
  undefined1 local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  idx_t local_2a0;
  unsigned_long local_298;
  idx_t local_290;
  unsigned_long local_288;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  ulong *local_258;
  long local_250;
  ulong local_248;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer pbStack_190;
  pointer local_188;
  undefined1 local_180 [24];
  undefined1 local_168 [40];
  size_t local_140;
  __node_base_ptr p_Stack_138;
  MultiFileOptions local_130;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  local_60;
  idx_t iVar14;
  
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"ignore_errors");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    CVar17.set_by_user = false;
    CVar17.value = false;
  }
  else {
    uVar12 = (*pp_Var15[0xc])(deserializer);
    pp_Var15 = deserializer->_vptr_Deserializer;
    CVar17 = SUB42((uVar12 & 0xff) << 8,0);
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"buffer_sample_size");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    iVar14 = 0;
  }
  else {
    iVar13 = (*pp_Var15[0x15])(deserializer);
    iVar14 = CONCAT44(extraout_var,iVar13);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&local_2f8,deserializer,0x66,"null_str");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"compression");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_130,deserializer);
    FVar3 = EnumUtil::FromString<duckdb::FileCompressionType>
                      ((char *)CONCAT26(local_130._6_2_,CONCAT24(local_130._4_2_,local_130._0_4_)));
    puVar16 = (undefined1 *)CONCAT26(local_130._6_2_,CONCAT24(local_130._4_2_,local_130._0_4_));
    if ((size_type *)puVar16 != &local_130.hive_types_schema._M_h._M_bucket_count) {
      operator_delete(puVar16);
    }
  }
  else {
    iVar13 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    FVar3 = (FileCompressionType)iVar13;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"allow_quoted_nulls");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_414 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_414 = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x69,"maximum_line_size");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar18 = CSVOption<unsigned_long>::Deserialize(deserializer);
  local_288 = CVar18.value;
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6a,"normalize_names");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_418 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_418 = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_3a8,deserializer,0x6b,"force_not_null");
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6c,"all_varchar");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_41c = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_41c = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6d,"sample_size_chunks");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_3d8 = 0;
  }
  else {
    iVar13 = (*pp_Var15[0x15])(deserializer);
    local_3d8 = CONCAT44(extraout_var_00,iVar13);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6e,"auto_detect");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_420 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_420 = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6f,"file_path");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1b8 = local_1a8;
    local_1a8[0] = 0;
    local_1b0 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_1b8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x70,"decimal_separator");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1d8 = local_1c8;
    local_1c8[0] = 0;
    local_1d0 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_1d8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x71,"null_padding");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_424 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_424 = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x72,"buffer_size");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 != '\0') {
    (*pp_Var15[0x15])(deserializer);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x73,"file_options");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  MultiFileOptions::Deserialize(&local_130,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_290 = iVar14;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_3d0,deserializer,0x74,"force_quote");
  local_358 = (ulong *)&local_348;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"reject_errors","");
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x75,"rejects_table_name");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_400 = &local_3f0;
    if (local_358 == (ulong *)&local_348) {
      uStack_3e8 = uStack_340;
    }
    else {
      local_400 = local_358;
    }
    local_3f0 = (ulong)uStack_347 << 8;
    local_3f8 = local_350;
    local_350 = 0;
    local_348 = 0;
    local_358 = (ulong *)&local_348;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_400,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    if (local_358 != (ulong *)&local_348) {
      operator_delete(local_358);
    }
  }
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x76,"rejects_limit");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    iVar14 = 0;
  }
  else {
    iVar13 = (*pp_Var15[0x15])(deserializer);
    iVar14 = CONCAT44(extraout_var_01,iVar13);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  Deserializer::ReadDeletedProperty<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x77,"rejects_recovery_columns");
  Deserializer::ReadDeletedProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0x78,"rejects_recovery_column_ids");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x79,"delimiter");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  single_byte_delimiter = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7a,"quote");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar5 = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7b,"escape");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar6 = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7c,"header");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar7 = CSVOption<bool>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x7d,"num_cols");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_3e0 = 0;
  }
  else {
    iVar13 = (*pp_Var15[0x15])(deserializer);
    local_3e0 = CONCAT44(extraout_var_02,iVar13);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7e,"new_line");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar8 = CSVOption<duckdb::NewLineIdentifier>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7f,"skip_rows");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar19 = CSVOption<unsigned_long>::Deserialize(deserializer);
  local_298 = CVar19.value;
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x80,"date_format");
  Deserializer::
  Read<std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>>
            ((type *)&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x81,"sniffer_user_mismatch_error");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1f8 = local_1e8;
    local_1e8[0] = 0;
    local_1f0 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_1f8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x82,"parallel");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    local_428 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    local_428 = SUB41(iVar13,0);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_380,deserializer,0x83,"was_type_manually_set");
  local_2a0 = iVar14;
  local_218 = local_208;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"reject_scans","");
  local_2c8 = 0;
  local_2c0 = &local_2b0;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_2c0,local_218,local_218 + local_210);
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x84,"rejects_scan_name");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_280.value._M_dataplus._M_p = (pointer)&local_280.value.field_2;
    local_280.set_by_user = (bool)local_2c8;
    if (local_2c0 == &local_2b0) {
      local_280.value.field_2._8_8_ = local_2b0._8_8_;
    }
    else {
      local_280.value._M_dataplus._M_p = (pointer)local_2c0;
    }
    local_280.value._M_string_length = local_2b8;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = '\0';
    local_2c0 = &local_2b0;
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Deserialize(&local_280,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0);
    }
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&local_318,deserializer,0x85,"name_list");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (&local_338,deserializer,0x86,"sql_type_list");
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x87,"sql_types_per_column");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_168._0_8_ = &p_Stack_138;
    local_168._8_8_ = &DAT_00000001;
    local_168._16_8_ = (_Hash_node_base *)0x0;
    local_168._24_8_ = 0;
    local_168._32_8_ = 0x3f800000;
    local_140 = 0;
    p_Stack_138 = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&local_98,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_168,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_168);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_168);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
              ((type *)&local_98,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x88,"columns_set");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    uVar4 = false;
  }
  else {
    iVar13 = (*pp_Var15[0xc])(deserializer);
    uVar4 = (undefined1)iVar13;
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x89,"comment");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    CVar9.set_by_user = false;
    CVar9.value = '\0';
  }
  else {
    (*pp_Var15[6])(deserializer);
    CVar9 = CSVOption<char>::Deserialize(deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8a,"rows_until_header");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar11 == '\0') {
    iVar14 = 0;
  }
  else {
    iVar13 = (*pp_Var15[0x15])(deserializer);
    iVar14 = CONCAT44(extraout_var_03,iVar13);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar11 & 0xff));
  iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8b,"encoding");
  if ((char)iVar13 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_238 = local_228;
    local_228[0] = 0;
    local_230 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_238,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8c,"strict_mode");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar10 = CSVOption<bool>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8d,"multi_byte_delimiter");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Deserialize((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_168,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  SerializedCSVReaderOptions
            (__return_storage_ptr__,single_byte_delimiter,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_168);
  (__return_storage_ptr__->options).ignore_errors = CVar17;
  (__return_storage_ptr__->options).buffer_sample_size = local_290;
  local_188 = (__return_storage_ptr__->options).null_str.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2f8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198 = (__return_storage_ptr__->options).null_str.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_190 = (__return_storage_ptr__->options).null_str.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_2f8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2f8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_198);
  (__return_storage_ptr__->options).compression = FVar3;
  (__return_storage_ptr__->options).allow_quoted_nulls = local_414;
  (__return_storage_ptr__->options).maximum_line_size.set_by_user = CVar18.set_by_user;
  *(undefined4 *)&(__return_storage_ptr__->options).maximum_line_size.field_0x1 = local_2cf;
  *(uint *)&(__return_storage_ptr__->options).maximum_line_size.field_0x4 =
       CONCAT31(uStack_2cb,local_2cf._3_1_);
  (__return_storage_ptr__->options).maximum_line_size.value = local_288;
  (__return_storage_ptr__->options).normalize_names = local_418;
  pvVar1 = &(__return_storage_ptr__->options).force_not_null;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  (__return_storage_ptr__->options).force_not_null.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_3a8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  (__return_storage_ptr__->options).force_not_null.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       local_3a8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).force_not_null.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_3a8.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._12_4_,
                local_3a8.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset);
  (pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_3a8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).force_not_null.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_3a8.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._12_4_,
                local_3a8.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_offset);
  local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->options).all_varchar = local_41c;
  (__return_storage_ptr__->options).sample_size_chunks = local_3d8;
  (__return_storage_ptr__->options).auto_detect = local_420;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).file_path,(string *)&local_1b8);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).decimal_separator,(string *)&local_1d8);
  (__return_storage_ptr__->options).null_padding = local_424;
  (__return_storage_ptr__->file_options).filename = local_130.filename;
  (__return_storage_ptr__->file_options).hive_partitioning = local_130.hive_partitioning;
  (__return_storage_ptr__->file_options).auto_detect_hive_partitioning =
       local_130.auto_detect_hive_partitioning;
  (__return_storage_ptr__->file_options).union_by_name = local_130.union_by_name;
  (__return_storage_ptr__->file_options).hive_types_autocast = local_130.hive_types_autocast;
  (__return_storage_ptr__->file_options).mapping = local_130.mapping;
  if (&local_130 == &__return_storage_ptr__->file_options) {
    ::std::__cxx11::string::_M_assign
              ((string *)&(__return_storage_ptr__->file_options).filename_column);
  }
  else {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(__return_storage_ptr__->file_options).hive_types_schema,
               &local_130.hive_types_schema._M_h);
    ::std::__cxx11::string::_M_assign
              ((string *)&(__return_storage_ptr__->file_options).filename_column);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(__return_storage_ptr__->file_options).custom_options,
               &local_130.custom_options._M_h);
  }
  pvVar1 = &(__return_storage_ptr__->options).force_quote;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  lVar2 = local_3f8;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p + 4) =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p._4_4_;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base.field_0xc =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._12_4_;
  *(undefined4 *)
   &(pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p + 4) =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p._4_4_;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_offset;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base.field_0xc =
       local_3d0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._12_4_;
  local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  if (local_400 == &local_3f0) {
    uStack_240 = (undefined4)uStack_3e8;
    uStack_23c = uStack_3e8._4_4_;
    local_400 = &local_248;
  }
  local_250 = local_3f8;
  local_3f8 = 0;
  local_3f0 = local_3f0 & 0xffffffffffffff00;
  local_198 = (pointer)((ulong)local_198 & 0xffffffffffffff00);
  puVar16 = (undefined1 *)(lVar2 + (long)local_400);
  local_258 = local_400;
  local_400 = &local_3f0;
  pbStack_190 = (pointer)local_180;
  ::std::__cxx11::string::_M_construct<char*>((string *)&pbStack_190,local_258,puVar16);
  (__return_storage_ptr__->options).rejects_table_name.set_by_user = (bool)local_198._0_1_;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).rejects_table_name.value,
             (string *)&pbStack_190);
  if (pbStack_190 != (pointer)local_180) {
    operator_delete(pbStack_190);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  (__return_storage_ptr__->options).rejects_limit = local_2a0;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.quote = CVar5;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.escape = CVar6;
  (__return_storage_ptr__->options).dialect_options.header = CVar7;
  (__return_storage_ptr__->options).dialect_options.num_cols = local_3e0;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.new_line = CVar8;
  (__return_storage_ptr__->options).dialect_options.skip_rows.set_by_user = CVar19.set_by_user;
  *(undefined4 *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x1 = local_2d6;
  *(uint *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x4 =
       CONCAT31(uStack_2d2,local_2d6._3_1_);
  (__return_storage_ptr__->options).dialect_options.skip_rows.value = local_298;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::operator=(&(__return_storage_ptr__->options).dialect_options.date_format._M_t,&local_60);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).sniffer_user_mismatch_error,
             (string *)&local_1f8);
  (__return_storage_ptr__->options).parallel = local_428;
  pvVar1 = &(__return_storage_ptr__->options).was_type_manually_set;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  (__return_storage_ptr__->options).was_type_manually_set.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_380.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  (__return_storage_ptr__->options).was_type_manually_set.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       local_380.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).was_type_manually_set.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_380.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._12_4_,
                local_380.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset);
  (pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_380.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).was_type_manually_set.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_380.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._12_4_,
                local_380.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_offset);
  local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->options).rejects_scan_name.set_by_user = local_280.set_by_user;
  ::std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->options).rejects_scan_name.value);
  local_188 = (__return_storage_ptr__->options).name_list.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198 = (__return_storage_ptr__->options).name_list.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_190 = (__return_storage_ptr__->options).name_list.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_198);
  local_188 = (pointer)(__return_storage_ptr__->options).sql_type_list.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_198 = (pointer)(__return_storage_ptr__->options).sql_type_list.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pbStack_190 = (pointer)(__return_storage_ptr__->options).sql_type_list.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(__return_storage_ptr__->options).sql_types_per_column._M_h,&local_98);
  (__return_storage_ptr__->options).columns_set = (bool)uVar4;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.comment = CVar9;
  (__return_storage_ptr__->options).dialect_options.rows_until_header = iVar14;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).encoding,(string *)&local_238);
  (__return_storage_ptr__->options).dialect_options.state_machine_options.strict_mode = CVar10;
  uVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8e,"multi_file_reader");
  if ((char)uVar11 == '\0') {
    uVar4 = false;
  }
  else {
    iVar13 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar4 = (undefined1)iVar13;
  }
  (__return_storage_ptr__->options).multi_file_reader = (bool)uVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar11 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8f,"buffer_size_option");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar18 = CSVOption<unsigned_long>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (__return_storage_ptr__->options).buffer_size_option.set_by_user = CVar18.set_by_user;
  (__return_storage_ptr__->options).buffer_size_option.value = CVar18.value;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if ((undefined1 *)local_168._8_8_ != local_168 + 0x18) {
    operator_delete((void *)local_168._8_8_);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_98);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_338);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.value._M_dataplus._M_p != &local_280.value.field_2) {
    operator_delete(local_280.value._M_dataplus._M_p);
  }
  if (local_380.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_380.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_3d0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_3d0.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_130.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename_column._M_dataplus._M_p != &local_130.filename_column.field_2) {
    operator_delete(local_130.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_130.hive_types_schema._M_h);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_3a8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_3a8.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  return __return_storage_ptr__;
}

Assistant:

SerializedCSVReaderOptions SerializedCSVReaderOptions::Deserialize(Deserializer &deserializer) {
	auto options_ignore_errors = deserializer.ReadPropertyWithExplicitDefault<bool>(100, "ignore_errors", false);
	auto options_buffer_sample_size = deserializer.ReadPropertyWithDefault<idx_t>(101, "buffer_sample_size");
	auto options_null_str = deserializer.ReadPropertyWithDefault<vector<string>>(102, "null_str");
	auto options_compression = deserializer.ReadProperty<FileCompressionType>(103, "compression");
	auto options_allow_quoted_nulls = deserializer.ReadPropertyWithDefault<bool>(104, "allow_quoted_nulls");
	auto options_maximum_line_size = deserializer.ReadProperty<CSVOption<idx_t>>(105, "maximum_line_size");
	auto options_normalize_names = deserializer.ReadPropertyWithDefault<bool>(106, "normalize_names");
	auto options_force_not_null = deserializer.ReadPropertyWithDefault<vector<bool>>(107, "force_not_null");
	auto options_all_varchar = deserializer.ReadPropertyWithDefault<bool>(108, "all_varchar");
	auto options_sample_size_chunks = deserializer.ReadPropertyWithDefault<idx_t>(109, "sample_size_chunks");
	auto options_auto_detect = deserializer.ReadPropertyWithDefault<bool>(110, "auto_detect");
	auto options_file_path = deserializer.ReadPropertyWithDefault<string>(111, "file_path");
	auto options_decimal_separator = deserializer.ReadPropertyWithDefault<string>(112, "decimal_separator");
	auto options_null_padding = deserializer.ReadPropertyWithDefault<bool>(113, "null_padding");
	deserializer.ReadDeletedProperty<idx_t>(114, "buffer_size");
	auto file_options = deserializer.ReadProperty<MultiFileOptions>(115, "file_options");
	auto options_force_quote = deserializer.ReadPropertyWithDefault<vector<bool>>(116, "force_quote");
	auto options_rejects_table_name = deserializer.ReadPropertyWithExplicitDefault<string>(117, "rejects_table_name", "reject_errors");
	auto options_rejects_limit = deserializer.ReadPropertyWithDefault<idx_t>(118, "rejects_limit");
	deserializer.ReadDeletedProperty<vector<string>>(119, "rejects_recovery_columns");
	deserializer.ReadDeletedProperty<vector<idx_t>>(120, "rejects_recovery_column_ids");
	auto options_dialect_options_state_machine_options_delimiter = deserializer.ReadProperty<CSVOption<char>>(121, "delimiter");
	auto options_dialect_options_state_machine_options_quote = deserializer.ReadProperty<CSVOption<char>>(122, "quote");
	auto options_dialect_options_state_machine_options_escape = deserializer.ReadProperty<CSVOption<char>>(123, "escape");
	auto options_dialect_options_header = deserializer.ReadProperty<CSVOption<bool>>(124, "header");
	auto options_dialect_options_num_cols = deserializer.ReadPropertyWithDefault<idx_t>(125, "num_cols");
	auto options_dialect_options_state_machine_options_new_line = deserializer.ReadProperty<CSVOption<NewLineIdentifier>>(126, "new_line");
	auto options_dialect_options_skip_rows = deserializer.ReadProperty<CSVOption<idx_t>>(127, "skip_rows");
	auto options_dialect_options_date_format = deserializer.ReadProperty<map<LogicalTypeId, CSVOption<StrpTimeFormat>>>(128, "date_format");
	auto options_sniffer_user_mismatch_error = deserializer.ReadPropertyWithDefault<string>(129, "sniffer_user_mismatch_error");
	auto options_parallel = deserializer.ReadPropertyWithDefault<bool>(130, "parallel");
	auto options_was_type_manually_set = deserializer.ReadPropertyWithDefault<vector<bool>>(131, "was_type_manually_set");
	auto options_rejects_scan_name = deserializer.ReadPropertyWithExplicitDefault<CSVOption<string>>(132, "rejects_scan_name", {"reject_scans"});
	auto options_name_list = deserializer.ReadPropertyWithDefault<vector<string>>(133, "name_list");
	auto options_sql_type_list = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(134, "sql_type_list");
	auto options_sql_types_per_column = deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(135, "sql_types_per_column");
	auto options_columns_set = deserializer.ReadPropertyWithExplicitDefault<bool>(136, "columns_set", false);
	auto options_dialect_options_state_machine_options_comment = deserializer.ReadPropertyWithExplicitDefault<CSVOption<char>>(137, "comment", CSVOption<char>('\0'));
	auto options_dialect_options_rows_until_header = deserializer.ReadPropertyWithDefault<idx_t>(138, "rows_until_header");
	auto options_encoding = deserializer.ReadPropertyWithDefault<string>(139, "encoding");
	auto options_dialect_options_state_machine_options_strict_mode = deserializer.ReadProperty<CSVOption<bool>>(140, "strict_mode");
	auto options_multi_byte_delimiter = deserializer.ReadProperty<CSVOption<string>>(141, "multi_byte_delimiter");
	SerializedCSVReaderOptions result(options_dialect_options_state_machine_options_delimiter, options_multi_byte_delimiter);
	result.options.ignore_errors = options_ignore_errors;
	result.options.buffer_sample_size = options_buffer_sample_size;
	result.options.null_str = std::move(options_null_str);
	result.options.compression = options_compression;
	result.options.allow_quoted_nulls = options_allow_quoted_nulls;
	result.options.maximum_line_size = options_maximum_line_size;
	result.options.normalize_names = options_normalize_names;
	result.options.force_not_null = std::move(options_force_not_null);
	result.options.all_varchar = options_all_varchar;
	result.options.sample_size_chunks = options_sample_size_chunks;
	result.options.auto_detect = options_auto_detect;
	result.options.file_path = std::move(options_file_path);
	result.options.decimal_separator = std::move(options_decimal_separator);
	result.options.null_padding = options_null_padding;
	result.file_options = file_options;
	result.options.force_quote = std::move(options_force_quote);
	result.options.rejects_table_name = std::move(options_rejects_table_name);
	result.options.rejects_limit = options_rejects_limit;
	result.options.dialect_options.state_machine_options.quote = options_dialect_options_state_machine_options_quote;
	result.options.dialect_options.state_machine_options.escape = options_dialect_options_state_machine_options_escape;
	result.options.dialect_options.header = options_dialect_options_header;
	result.options.dialect_options.num_cols = options_dialect_options_num_cols;
	result.options.dialect_options.state_machine_options.new_line = options_dialect_options_state_machine_options_new_line;
	result.options.dialect_options.skip_rows = options_dialect_options_skip_rows;
	result.options.dialect_options.date_format = options_dialect_options_date_format;
	result.options.sniffer_user_mismatch_error = std::move(options_sniffer_user_mismatch_error);
	result.options.parallel = options_parallel;
	result.options.was_type_manually_set = std::move(options_was_type_manually_set);
	result.options.rejects_scan_name = options_rejects_scan_name;
	result.options.name_list = std::move(options_name_list);
	result.options.sql_type_list = std::move(options_sql_type_list);
	result.options.sql_types_per_column = std::move(options_sql_types_per_column);
	result.options.columns_set = options_columns_set;
	result.options.dialect_options.state_machine_options.comment = options_dialect_options_state_machine_options_comment;
	result.options.dialect_options.rows_until_header = options_dialect_options_rows_until_header;
	result.options.encoding = std::move(options_encoding);
	result.options.dialect_options.state_machine_options.strict_mode = options_dialect_options_state_machine_options_strict_mode;
	deserializer.ReadPropertyWithDefault<bool>(142, "multi_file_reader", result.options.multi_file_reader);
	deserializer.ReadProperty<CSVOption<idx_t>>(143, "buffer_size_option", result.options.buffer_size_option);
	return result;
}